

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O3

Error __thiscall
asmjit::StringBuilder::_opNumber
          (StringBuilder *this,uint32_t op,uint64_t i,uint32_t base,size_t width,uint32_t flags)

{
  Error EVar1;
  long lVar2;
  char *__dest;
  char cVar3;
  size_t sVar4;
  ulong uVar5;
  size_t __n;
  uint uVar6;
  uint64_t uVar7;
  ulong uVar8;
  char *__src;
  long lVar9;
  long lVar10;
  bool bVar11;
  bool bVar12;
  char buf [128];
  char acStack_3c [12];
  
  uVar6 = 10;
  if (0xffffffdc < base - 0x25) {
    uVar6 = base;
  }
  if ((long)i < 0 && (int)flags < 0) {
    cVar3 = '-';
    bVar12 = false;
    uVar7 = -i;
  }
  else {
    uVar7 = i;
    if ((flags & 1) == 0) {
      bVar12 = (flags & 2) == 0;
      cVar3 = (char)(flags & 2) << 4;
    }
    else {
      cVar3 = '+';
      bVar12 = false;
    }
  }
  uVar8 = (ulong)uVar6;
  uVar5 = 0;
  lVar10 = 0;
  do {
    lVar9 = lVar10;
    uVar5 = uVar5 + 1;
    acStack_3c[lVar9 + 3] = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ"[uVar7 % uVar8];
    lVar10 = lVar9 + -1;
    bVar11 = uVar8 <= uVar7;
    uVar7 = uVar7 / uVar8;
  } while (bVar11);
  __src = acStack_3c + lVar9 + 3;
  if ((flags & 4) != 0) {
    lVar2 = -2;
    if (i == 0 || uVar6 != 8) {
      if (uVar6 != 0x10) goto LAB_001664c0;
      lVar2 = -3;
      acStack_3c[lVar9 + 2] = 'x';
    }
    __src = acStack_3c + lVar9 + lVar2 + 4;
    *__src = '0';
  }
LAB_001664c0:
  if (!bVar12) {
    __src[-1] = cVar3;
    __src = __src + -1;
  }
  uVar8 = 0x100;
  if (width < 0x100) {
    uVar8 = width;
  }
  __n = uVar8 + lVar10;
  if (uVar8 < (ulong)-lVar10) {
    __n = 0;
  }
  sVar4 = uVar8 - uVar5;
  if (uVar8 < uVar5) {
    sVar4 = 0;
  }
  __dest = prepare(this,op,(size_t)(acStack_3c + sVar4 + -(long)__src + 4));
  if (__dest == (char *)0x0) {
    EVar1 = 1;
  }
  else {
    memcpy(__dest,__src,(size_t)(acStack_3c + lVar10 + -(long)__src + 4));
    memset(__dest + (long)(acStack_3c + (lVar10 - (long)__src) + 4),0x30,__n);
    if (width < uVar5) {
      uVar5 = width;
    }
    if (0xff < uVar5) {
      uVar5 = 0x100;
    }
    memcpy(__dest + (long)(acStack_3c + (uVar8 - uVar5) + (lVar10 - (long)__src) + 4),
           acStack_3c + lVar9 + 3,-lVar10);
    EVar1 = 0;
  }
  return EVar1;
}

Assistant:

Error StringBuilder::_opNumber(uint32_t op, uint64_t i, uint32_t base, size_t width, uint32_t flags) noexcept {
  if (base < 2 || base > 36)
    base = 10;

  char buf[128];
  char* p = buf + ASMJIT_ARRAY_SIZE(buf);

  uint64_t orig = i;
  char sign = '\0';

  // --------------------------------------------------------------------------
  // [Sign]
  // --------------------------------------------------------------------------

  if ((flags & kStringFormatSigned) != 0 && static_cast<int64_t>(i) < 0) {
    i = static_cast<uint64_t>(-static_cast<int64_t>(i));
    sign = '-';
  }
  else if ((flags & kStringFormatShowSign) != 0) {
    sign = '+';
  }
  else if ((flags & kStringFormatShowSpace) != 0) {
    sign = ' ';
  }

  // --------------------------------------------------------------------------
  // [Number]
  // --------------------------------------------------------------------------

  do {
    uint64_t d = i / base;
    uint64_t r = i % base;

    *--p = StringBuilder_numbers[r];
    i = d;
  } while (i);

  size_t numberLength = (size_t)(buf + ASMJIT_ARRAY_SIZE(buf) - p);

  // --------------------------------------------------------------------------
  // [Alternate Form]
  // --------------------------------------------------------------------------

  if ((flags & kStringFormatAlternate) != 0) {
    if (base == 8) {
      if (orig != 0)
        *--p = '0';
    }
    if (base == 16) {
      *--p = 'x';
      *--p = '0';
    }
  }

  // --------------------------------------------------------------------------
  // [Width]
  // --------------------------------------------------------------------------

  if (sign != 0)
    *--p = sign;

  if (width > 256)
    width = 256;

  if (width <= numberLength)
    width = 0;
  else
    width -= numberLength;

  // --------------------------------------------------------------------------
  // Write]
  // --------------------------------------------------------------------------

  size_t prefixLength = (size_t)(buf + ASMJIT_ARRAY_SIZE(buf) - p) - numberLength;
  char* data = prepare(op, prefixLength + width + numberLength);

  if (!data)
    return DebugUtils::errored(kErrorNoHeapMemory);

  ::memcpy(data, p, prefixLength);
  data += prefixLength;

  ::memset(data, '0', width);
  data += width;

  ::memcpy(data, p + prefixLength, numberLength);
  return kErrorOk;
}